

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
ptc::osout<char>(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                 *__return_storage_ptr__,basic_ostream<char,_std::char_traits<char>_> *os)

{
  undefined8 uVar1;
  savebuf<char> sbuf;
  Print<char> printer;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  undefined **local_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  locale local_240 [8];
  undefined8 local_238;
  undefined1 *local_230;
  long local_228;
  undefined1 local_220;
  undefined7 uStack_21f;
  Print<char> local_210;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  Print<char>::Print(&local_210);
  uVar1 = *(undefined8 *)(&os->field_0xe8 + (long)os->_vptr_basic_ostream[-3]);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_278 = (undefined **)sysconf;
  local_270 = 0;
  uStack_268 = 0;
  local_260 = 0;
  uStack_258 = 0;
  local_250 = 0;
  uStack_248 = 0;
  std::locale::locale(local_240);
  local_278 = &PTR__savebuf_001596b0;
  local_228 = 0;
  local_220 = 0;
  local_238 = uVar1;
  local_230 = &local_220;
  std::ios::rdbuf((streambuf *)((long)&os->_vptr_basic_ostream + (long)os->_vptr_basic_ostream[-3]))
  ;
  std::__cxx11::stringbuf::str();
  Print<char>::print_backend<std::ostream&,std::__cxx11::string>(&local_210,os,&local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  std::ios::rdbuf((streambuf *)((long)&os->_vptr_basic_ostream + (long)os->_vptr_basic_ostream[-3]))
  ;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_230,local_230 + local_228);
  local_278 = &PTR__savebuf_001596b0;
  if (local_230 != &local_220) {
    operator_delete(local_230,CONCAT71(uStack_21f,local_220) + 1);
  }
  local_278 = (undefined **)sysconf;
  std::locale::~locale(local_240);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.pattern._M_dataplus._M_p != &local_210.pattern.field_2) {
    operator_delete(local_210.pattern._M_dataplus._M_p,
                    local_210.pattern.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.sep._M_dataplus._M_p != &local_210.sep.field_2) {
    operator_delete(local_210.sep._M_dataplus._M_p,local_210.sep.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.end._M_dataplus._M_p != &local_210.end.field_2) {
    operator_delete(local_210.end._M_dataplus._M_p,local_210.end.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline const std::basic_string<T> osout( std::basic_ostream<T>& os = select_cout<T>::cout, const Args&... args )
   {
    Print<T> printer;
    std::basic_streambuf<T>* buf = os.rdbuf();
    std::basic_ostringstream<T> str;

    savebuf<T> sbuf( buf );
    os.rdbuf( &sbuf );

    ( ( str << args << printer.getSep() ), ... );
    printer( os, str.str() );
    os.rdbuf( buf );
    return sbuf.str();
   }